

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<tinyusdz::value::matrix4f> * __thiscall
tinyusdz::XformOp::get_value<tinyusdz::value::matrix4f>
          (optional<tinyusdz::value::matrix4f> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  optional<tinyusdz::value::matrix4f> local_ac;
  undefined1 local_64 [8];
  matrix4f value;
  TimeSampleInterpolationType interp_local;
  double t_local;
  XformOp *this_local;
  
  value.m[3][2] = (float)interp;
  unique0x100000d4 = t;
  bVar1 = is_timesamples(this);
  if (bVar1) {
    tinyusdz::value::matrix4f::matrix4f((matrix4f *)local_64);
    bVar1 = get_interpolated_value<tinyusdz::value::matrix4f>
                      (this,(matrix4f *)local_64,stack0xffffffffffffffe0,
                       (TimeSampleInterpolationType)value.m[3][2]);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::
      optional<tinyusdz::value::matrix4f,_0>(__return_storage_ptr__,(matrix4f *)local_64);
    }
    else {
      nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::optional(__return_storage_ptr__);
    }
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::matrix4f>(&local_ac,&this->_var);
    nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::
    optional<tinyusdz::value::matrix4f,_0>(__return_storage_ptr__,&local_ac);
    nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::~optional(&local_ac);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }